

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool whiteListedInterfaceProperty(string *prop)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  allocator local_91;
  value_type local_90;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_58,(string *)prop);
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,11ul>(&local_58,(char (*) [11])0x4aac50);
  std::__cxx11::string::~string((string *)&local_58);
  bVar2 = true;
  if (!bVar1) {
    if (whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&whiteListedInterfaceProperty(std::__cxx11::string_const&)::
                                   builtIns_abi_cxx11_);
      if (iVar3 != 0) {
        cmsys::
        hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::hash_set(&whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_);
        __cxa_atexit(cmsys::
                     hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                     ::~hash_set,
                     &whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_
                     ,&__dso_handle);
        __cxa_guard_release(&whiteListedInterfaceProperty(std::__cxx11::string_const&)::
                             builtIns_abi_cxx11_);
      }
    }
    if (whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_._M_ht.
        _M_num_elements == 0) {
      std::__cxx11::string::string((string *)&local_90,"COMPATIBLE_INTERFACE_BOOL",&local_91);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_70,
               &whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
               &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_90,"COMPATIBLE_INTERFACE_NUMBER_MAX",&local_91);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_70,
               &whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
               &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_90,"COMPATIBLE_INTERFACE_NUMBER_MIN",&local_91);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_70,
               &whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
               &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_90,"COMPATIBLE_INTERFACE_STRING",&local_91);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_70,
               &whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
               &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_90,"EXPORT_NAME",&local_91);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_70,
               &whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
               &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_90,"IMPORTED",&local_91);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_70,
               &whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
               &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_90,"NAME",&local_91);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_70,
               &whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
               &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string((string *)&local_90,"TYPE",&local_91);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_70,
               &whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
               &local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    sVar4 = cmsys::
            hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
            ::count(&whiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_.
                     _M_ht,prop);
    if (sVar4 == 0) {
      std::__cxx11::string::string((string *)&local_38,(string *)prop);
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,21ul>
                        (&local_38,(char (*) [21])"MAP_IMPORTED_CONFIG_");
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return bVar2;
}

Assistant:

static bool whiteListedInterfaceProperty(const std::string& prop)
{
  if(cmHasLiteralPrefix(prop, "INTERFACE_"))
    {
    return true;
    }
  static UNORDERED_SET<std::string> builtIns;
  if (builtIns.empty())
    {
    builtIns.insert("COMPATIBLE_INTERFACE_BOOL");
    builtIns.insert("COMPATIBLE_INTERFACE_NUMBER_MAX");
    builtIns.insert("COMPATIBLE_INTERFACE_NUMBER_MIN");
    builtIns.insert("COMPATIBLE_INTERFACE_STRING");
    builtIns.insert("EXPORT_NAME");
    builtIns.insert("IMPORTED");
    builtIns.insert("NAME");
    builtIns.insert("TYPE");
    }

  if (builtIns.count(prop))
    {
    return true;
    }

  if (cmHasLiteralPrefix(prop, "MAP_IMPORTED_CONFIG_"))
    {
    return true;
    }

  return false;
}